

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O1

string * __thiscall
DebugInfo::WriteReport_abi_cxx11_
          (string *__return_storage_ptr__,DebugInfo *this,DebugFilters *filters)

{
  pointer pSVar1;
  pointer pTVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  pointer pCVar5;
  long lVar6;
  bool bVar7;
  pointer pNVar8;
  pointer pNVar9;
  string *psVar10;
  pointer pOVar11;
  pointer pNVar12;
  uint uVar13;
  SymbolInfo *sym_1;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  pointer pSVar17;
  uint uVar18;
  pointer pCVar19;
  uint uVar20;
  __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_> __i;
  char *__needle;
  pointer pSVar21;
  pointer pTVar22;
  pointer pTVar23;
  long lVar24;
  pointer pNVar25;
  pointer pOVar26;
  pointer pOVar27;
  uint uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  NamespaceInfo *n;
  value_type *__x;
  value_type *pvVar31;
  int iVar32;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1_2;
  DebugInfo *this_00;
  string objFile;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> objectFiles;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> nameSpaces;
  string local_98;
  string *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> local_68;
  DebugInfo *local_50;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> local_48;
  
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __needle = (char *)(filters->name)._M_string_length;
  if (__needle != (char *)0x0) {
    __needle = (filters->name)._M_dataplus._M_p;
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (__needle != (char *)0x0) {
    sAppendPrintF(__return_storage_ptr__,"Only including things with \'%s\' in their name/file\n\n",
                  __needle);
  }
  sAppendPrintF(__return_storage_ptr__,"Functions by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFunction * 0.0009765625,0));
  pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar17 != pSVar1) {
    uVar14 = ((long)pSVar1 - (long)pSVar17 >> 4) * -0x5555555555555555;
    lVar6 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
              (pSVar17,pSVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pSVar1 - (long)pSVar17 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                (pSVar17,pSVar1);
    }
    else {
      pSVar21 = pSVar17 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                (pSVar17,pSVar21);
      for (; pSVar21 != pSVar1; pSVar21 = pSVar21 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                  (pSVar21);
      }
    }
  }
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50 = this;
  for (pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start; pSVar17 != pSVar1; pSVar17 = pSVar17 + 1)
  {
    iVar32 = 2;
    if ((uint)filters->minFunction <= pSVar17->size) {
      if (pSVar17->sectionType == Code) {
        pcVar16 = (pSVar17->name)._M_dataplus._M_p;
        GetObjectFileDesc_abi_cxx11_(&local_98,this,pSVar17->objectFileIndex);
        if (((__needle == (char *)0x0) ||
            (pcVar15 = strstr(pcVar16,__needle), pcVar15 != (char *)0x0)) ||
           (pcVar15 = strstr(local_98._M_dataplus._M_p,__needle), pcVar15 != (char *)0x0)) {
          iVar32 = 0;
          bVar7 = true;
          sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-80s %s\n",(ulong)(pSVar17->size >> 10),
                        (ulong)((pSVar17->size & 0x3ff) * 100 >> 10),pcVar16,
                        local_98._M_dataplus._M_p);
        }
        else {
          iVar32 = 3;
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        this = local_50;
        if (!bVar7) goto LAB_00103573;
      }
      iVar32 = 0;
    }
LAB_00103573:
    if ((iVar32 != 3) && (iVar32 != 0)) break;
  }
  sAppendPrintF(__return_storage_ptr__,
                "\nAggregated templates by size (kilobytes, min %.2f / %i):\n",
                SUB84((double)filters->minTemplate * 0.0009765625,0),
                (ulong)(uint)filters->minTemplateCount);
  pTVar23 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_78 = __return_storage_ptr__;
  if (pTVar23 != pTVar2) {
    uVar14 = ((long)pTVar2 - (long)pTVar23 >> 3) * -0x3333333333333333;
    lVar6 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
              (pTVar23,pTVar2,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar2 - (long)pTVar23 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                (pTVar23,pTVar2);
    }
    else {
      pTVar22 = pTVar23 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                (pTVar23,pTVar22);
      for (; pTVar22 != pTVar2; pTVar22 = pTVar22 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                  (pTVar22);
      }
    }
  }
  pTVar2 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar23 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pTVar23 != pTVar2; pTVar23 = pTVar23 + 1
      ) {
    uVar13 = pTVar23->size;
    iVar32 = 4;
    if ((uint)filters->minTemplate <= uVar13) {
      uVar18 = pTVar23->count;
      iVar32 = 5;
      if (((uint)filters->minTemplateCount <= uVar18) &&
         ((pcVar16 = (pTVar23->name)._M_dataplus._M_p, __needle == (char *)0x0 ||
          (pcVar15 = strstr(pcVar16,__needle), pcVar15 != (char *)0x0)))) {
        iVar32 = 0;
        sAppendPrintF(local_78,"%5d.%02d #%5d: %s\n",(ulong)(uVar13 >> 10),
                      (ulong)((uVar13 & 0x3ff) * 100 >> 10),(ulong)uVar18,pcVar16);
      }
    }
    if ((iVar32 != 5) && (iVar32 != 0)) break;
  }
  psVar10 = local_78;
  sAppendPrintF(local_78,"\nData by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minData * 0.0009765625,0));
  pSVar1 = (local_50->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  this_00 = local_50;
  for (pSVar17 = (local_50->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start; pSVar17 != pSVar1; pSVar17 = pSVar17 + 1)
  {
    iVar32 = 6;
    if ((uint)filters->minData <= pSVar17->size) {
      if (pSVar17->sectionType == Data) {
        pcVar16 = (pSVar17->name)._M_dataplus._M_p;
        GetObjectFileDesc_abi_cxx11_(&local_98,this_00,pSVar17->objectFileIndex);
        if (((__needle == (char *)0x0) ||
            (pcVar15 = strstr(pcVar16,__needle), pcVar15 != (char *)0x0)) ||
           (pcVar15 = strstr(local_98._M_dataplus._M_p,__needle), pcVar15 != (char *)0x0)) {
          iVar32 = 0;
          bVar7 = true;
          sAppendPrintF(psVar10,"%5d.%02d: %-50s %s\n",(ulong)(pSVar17->size >> 10),
                        (ulong)((pSVar17->size & 0x3ff) * 100 >> 10),pcVar16,
                        local_98._M_dataplus._M_p);
        }
        else {
          iVar32 = 7;
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_50;
        if (!bVar7) goto LAB_001037e0;
      }
      iVar32 = 0;
    }
LAB_001037e0:
    if ((iVar32 != 7) && (iVar32 != 0)) break;
  }
  sAppendPrintF(psVar10,"\nBSS by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minData * 0.0009765625,0));
  pSVar1 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar17 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start; pSVar17 != pSVar1; pSVar17 = pSVar17 + 1)
  {
    iVar32 = 8;
    if ((uint)filters->minData <= pSVar17->size) {
      if (pSVar17->sectionType == BSS) {
        pcVar16 = (pSVar17->name)._M_dataplus._M_p;
        GetObjectFileDesc_abi_cxx11_(&local_98,this_00,pSVar17->objectFileIndex);
        if (((__needle == (char *)0x0) ||
            (pcVar15 = strstr(pcVar16,__needle), pcVar15 != (char *)0x0)) ||
           (pcVar15 = strstr(local_98._M_dataplus._M_p,__needle), pcVar15 != (char *)0x0)) {
          iVar32 = 0;
          bVar7 = true;
          sAppendPrintF(psVar10,"%5d.%02d: %-50s %s\n",(ulong)(pSVar17->size >> 10),
                        (ulong)((pSVar17->size & 0x3ff) * 100 >> 10),pcVar16,
                        local_98._M_dataplus._M_p);
        }
        else {
          iVar32 = 9;
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_50;
        if (!bVar7) goto LAB_001038f0;
      }
      iVar32 = 0;
    }
LAB_001038f0:
    if ((iVar32 != 9) && (iVar32 != 0)) break;
  }
  sAppendPrintF(psVar10,"\nClasses/Namespaces by code size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minClass * 0.0009765625,0));
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (this_00->m_Namespaces).super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this_00->m_Namespaces).super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar3) {
    do {
      if ((uint)filters->minClass <= __x->codeSize) {
        std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::push_back(&local_48,__x);
      }
      __x = __x + 1;
    } while (__x != pvVar3);
  }
  pNVar12 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar9 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar24 = (long)local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (lVar24 >> 4) * -0x5555555555555555;
    lVar6 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
              (local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                (pNVar8,pNVar12);
      pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar9 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      pNVar25 = pNVar8 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                (pNVar8,pNVar25);
      for (; pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start,
          pNVar9 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish, pNVar25 != pNVar12;
          pNVar25 = pNVar25 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                  (pNVar25);
      }
    }
  }
  for (; pNVar12 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
      pNVar8 != local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pNVar8 = pNVar8 + 1) {
    local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar9;
    if ((__needle == (char *)0x0) ||
       (pcVar16 = strstr((pNVar8->name)._M_dataplus._M_p,__needle), pcVar16 != (char *)0x0)) {
      sAppendPrintF(psVar10,"%5d.%02d: %s\n",(ulong)(pNVar8->codeSize >> 10),
                    (ulong)((pNVar8->codeSize & 0x3ff) * 100 >> 10),(pNVar8->name)._M_dataplus._M_p)
      ;
    }
    pNVar9 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar12;
  }
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar9;
  sAppendPrintF(psVar10,"\nObject files by code size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFile * 0.0009765625,0));
  local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar31 = (this_00->m_ObjectFiles).
            super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar4 = (this_00->m_ObjectFiles).
           super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar31 != pvVar4) {
    do {
      if (((uint)filters->minFile <= pvVar31->codeSize) ||
         ((uint)filters->minFile <= pvVar31->contribCodeSize)) {
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back(&local_68,pvVar31);
      }
      pvVar31 = pvVar31 + 1;
    } while (pvVar31 != pvVar4);
  }
  pOVar27 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pOVar11 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar24 = (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (lVar24 >> 3) * 0x2e8ba2e8ba2e8ba3;
    lVar6 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
              (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x581) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                (pOVar11,pOVar27);
    }
    else {
      pOVar26 = pOVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                (pOVar11,pOVar26);
      for (; pOVar26 != pOVar27; pOVar26 = pOVar26 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                  (pOVar26);
      }
    }
  }
  pOVar11 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar27 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      GetObjectFileDesc_abi_cxx11_(&local_98,this_00,pOVar27->index);
      if ((__needle == (char *)0x0) ||
         (pcVar16 = strstr(local_98._M_dataplus._M_p,__needle), pcVar16 != (char *)0x0)) {
        uVar13 = pOVar27->codeSize;
        uVar18 = pOVar27->contribCodeSize;
        uVar14 = (ulong)((uVar18 & 0x3ff) * 100 >> 10);
        if ((float)uVar18 <= (float)uVar13 * 1.2) {
          sAppendPrintF(psVar10,"%5d.%02d: %s\n",(ulong)(uVar18 >> 10),uVar14,
                        local_98._M_dataplus._M_p);
        }
        else {
          sAppendPrintF(psVar10,"%5d.%02d: %s [%d.%02d with symbols]\n",(ulong)(uVar18 >> 10),uVar14
                        ,local_98._M_dataplus._M_p,(ulong)(uVar13 >> 10),
                        (uVar13 & 0x3ff) * 100 >> 10);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pOVar27 = pOVar27 + 1;
    } while (pOVar27 != pOVar11);
  }
  sAppendPrintF(psVar10,"\nObject files by data size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFile * 0.0009765625,0));
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::_M_erase_at_end
            (&local_68,
             local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pvVar31 = (this_00->m_ObjectFiles).
            super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar4 = (this_00->m_ObjectFiles).
           super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar31 != pvVar4) {
    do {
      if (((uint)filters->minFile <= pvVar31->dataSize) ||
         ((uint)filters->minFile <= pvVar31->contribDataSize)) {
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back(&local_68,pvVar31);
      }
      pvVar31 = pvVar31 + 1;
    } while (pvVar31 != pvVar4);
  }
  pOVar27 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pOVar11 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar24 = (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (lVar24 >> 3) * 0x2e8ba2e8ba2e8ba3;
    lVar6 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
              (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x581) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                (pOVar11,pOVar27);
    }
    else {
      pOVar26 = pOVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                (pOVar11,pOVar26);
      for (; pOVar26 != pOVar27; pOVar26 = pOVar26 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                  ();
      }
    }
  }
  pOVar11 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar27 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      GetObjectFileDesc_abi_cxx11_(&local_98,this_00,pOVar27->index);
      if ((__needle == (char *)0x0) ||
         (pcVar16 = strstr(local_98._M_dataplus._M_p,__needle), pcVar16 != (char *)0x0)) {
        uVar13 = pOVar27->dataSize;
        uVar18 = pOVar27->contribDataSize;
        uVar14 = (ulong)((uVar18 & 0x3ff) * 100 >> 10);
        if ((float)uVar18 <= (float)uVar13 * 1.2) {
          sAppendPrintF(local_78,"%5d.%02d: %s\n",(ulong)(uVar18 >> 10),uVar14,
                        local_98._M_dataplus._M_p);
        }
        else {
          sAppendPrintF(local_78,"%5d.%02d: %s [%d.%02d with symbols]\n",(ulong)(uVar18 >> 10),
                        uVar14,local_98._M_dataplus._M_p,(ulong)(uVar13 >> 10),
                        (uVar13 & 0x3ff) * 100 >> 10);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pOVar27 = pOVar27 + 1;
    } while (pOVar27 != pOVar11);
  }
  psVar10 = local_78;
  pCVar19 = (this_00->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar5 = (this_00->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar13 = 0;
  uVar18 = 0;
  uVar20 = 0;
  if (pCVar19 != pCVar5) {
    uVar20 = 0;
    uVar18 = 0;
    do {
      uVar29 = pCVar19->size;
      uVar30 = 0;
      if (pCVar19->sectionType == Code) {
        uVar30 = uVar29;
      }
      uVar18 = uVar18 + uVar30;
      if (pCVar19->sectionType != Data) {
        uVar29 = 0;
      }
      uVar20 = uVar20 + uVar29;
      pCVar19 = pCVar19 + 1;
    } while (pCVar19 != pCVar5);
  }
  pSVar17 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pSVar1 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar17 != pSVar1) {
    uVar13 = 0;
    do {
      uVar29 = 0;
      if (pSVar17->sectionType == Code) {
        uVar29 = pSVar17->size;
      }
      uVar13 = uVar13 + uVar29;
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != pSVar1);
  }
  uVar28 = 0;
  sAppendPrintF(local_78,"\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n",
                (ulong)(uVar18 >> 10),(ulong)((uVar18 & 0x3ff) * 100 >> 10),(ulong)(uVar13 >> 10),
                (ulong)((uVar13 & 0x3ff) * 100 >> 10));
  pSVar17 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pSVar1 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar17 != pSVar1) {
    uVar28 = 0;
    do {
      uVar29 = 0;
      if (pSVar17->sectionType == Data) {
        uVar29 = pSVar17->size;
      }
      uVar28 = uVar28 + uVar29;
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != pSVar1);
  }
  uVar13 = 0;
  sAppendPrintF(psVar10,"Overall data:  %5d.%02d kb (%d.%02d with symbols)\n",(ulong)(uVar20 >> 10),
                (ulong)((uVar20 & 0x3ff) * 100 >> 10),(ulong)(uVar28 >> 10),
                (ulong)((uVar28 & 0x3ff) * 100 >> 10));
  pSVar17 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pSVar1 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar17 != pSVar1) {
    uVar13 = 0;
    do {
      uVar29 = 0;
      if (pSVar17->sectionType == BSS) {
        uVar29 = pSVar17->size;
      }
      uVar13 = uVar13 + uVar29;
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != pSVar1);
  }
  uVar18 = 0;
  sAppendPrintF(psVar10,"Overall BSS:   %5d.%02d kb\n",(ulong)(uVar13 >> 10),
                (ulong)((uVar13 & 0x3ff) * 100 >> 10));
  pSVar17 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pSVar1 = (this_00->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar17 != pSVar1) {
    uVar18 = 0;
    do {
      uVar29 = 0;
      if (pSVar17->sectionType == Unknown) {
        uVar29 = pSVar17->size;
      }
      uVar18 = uVar18 + uVar29;
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != pSVar1);
  }
  if (uVar18 != 0) {
    sAppendPrintF(psVar10,"Overall other: %5d.%02d kb\n",(ulong)(uVar18 >> 10),
                  (ulong)((uVar18 & 0x3ff) * 100 >> 10));
  }
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::~vector(&local_68);
  std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::~vector(&local_48);
  return psVar10;
}

Assistant:

std::string DebugInfo::WriteReport(const DebugFilters& filters)
{
    std::string Report;
    const char* filterName = filters.name.empty() ? NULL : filters.name.c_str();

    Report.reserve(64 * 1024);
    if (filterName)
    {
        sAppendPrintF(Report, "Only including things with '%s' in their name/file\n\n", filterName);
    }

    // symbols
    sAppendPrintF(Report, "Functions by size (kilobytes, min %.2f):\n", filters.minFunction/1024.0);
    std::sort(m_Symbols.begin(), m_Symbols.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.objectFileIndex != b.objectFileIndex)
            return a.objectFileIndex < b.objectFileIndex;
        return a.name < b.name;
    });

    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minFunction)
            break;
        if (sym.sectionType == SectionType::Code)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-80s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    // templates
    sAppendPrintF(Report, "\nAggregated templates by size (kilobytes, min %.2f / %i):\n", filters.minTemplate/1024.0, filters.minTemplateCount);

    std::sort(m_Templates.begin(), m_Templates.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.count != b.count)
            return a.count > b.count;
        return a.name < b.name;
    });

    for (const auto& tpl : m_Templates)
    {
        if (tpl.size < filters.minTemplate)
            break;
        if (tpl.count < filters.minTemplateCount)
            continue;
        const char* name1 = tpl.name.c_str();
        if (filterName && !strstr(name1, filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d #%5d: %s\n",
            tpl.size / 1024, (tpl.size % 1024) * 100 / 1024,
            tpl.count,
            name1);
    }

    sAppendPrintF(Report, "\nData by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::Data)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nBSS by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::BSS)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nClasses/Namespaces by code size (kilobytes, min %.2f):\n", filters.minClass/1024.0);
    std::vector<NamespaceInfo> nameSpaces;
    for (const auto& n : m_Namespaces)
    {
        if (n.codeSize >= filters.minClass)
            nameSpaces.push_back(n);
    }
    std::sort(nameSpaces.begin(), nameSpaces.end(), [](const auto& a, const auto& b)
    {
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.name < b.name;
    });
    for (const auto& n : nameSpaces)
    {
        const std::string& name = n.name;
        if (filterName && !strstr(name.c_str(), filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d: %s\n",
            n.codeSize / 1024, (n.codeSize % 1024) * 100 / 1024, name.c_str());
    }

    sAppendPrintF(Report, "\nObject files by code size (kilobytes, min %.2f):\n", filters.minFile/1024.0);
    std::vector<ObjectFileInfo> objectFiles;
    for (const auto& f : m_ObjectFiles)
    {
        if (f.codeSize >= filters.minFile || f.contribCodeSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribCodeSize != b.contribCodeSize)
            return a.contribCodeSize > b.contribCodeSize;
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        return a.index < b.index;
    });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.codeSize * 1.2f >= f.contribCodeSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.codeSize / 1024, (f.codeSize % 1024) * 100 / 1024);
        }
    }

    sAppendPrintF(Report, "\nObject files by data size (kilobytes, min %.2f):\n", filters.minFile / 1024.0);
    objectFiles.clear();
    for (const auto& f : m_ObjectFiles)
    {
        if (f.dataSize >= filters.minFile || f.contribDataSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribDataSize != b.contribDataSize)
            return a.contribDataSize > b.contribDataSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.index < b.index;
        });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.dataSize * 1.2f >= f.contribDataSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.dataSize / 1024, (f.dataSize % 1024) * 100 / 1024);
        }
    }


    uint32_t contribCodeSize = 0, contribDataSize = 0;
    for (const auto& cnt : m_Contribs)
    {
        if (cnt.sectionType == SectionType::Code)
            contribCodeSize += cnt.size;
        if (cnt.sectionType == SectionType::Data)
            contribDataSize += cnt.size;
    }

    uint32_t size;
    size = CountSizeInSection(SectionType::Code);
    sAppendPrintF(Report, "\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n", contribCodeSize / 1024, (contribCodeSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Data);
    sAppendPrintF(Report, "Overall data:  %5d.%02d kb (%d.%02d with symbols)\n", contribDataSize / 1024, (contribDataSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::BSS);
    sAppendPrintF(Report, "Overall BSS:   %5d.%02d kb\n", size / 1024,
        (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Unknown);
    if (size > 0)
    {
        sAppendPrintF(Report, "Overall other: %5d.%02d kb\n", size / 1024,
            (size % 1024) * 100 / 1024);
    }

    return Report;
}